

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
                 *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_1,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2,int dist)

{
  comm *comm;
  uint uVar1;
  pointer puVar2;
  anon_class_64_8_0d7252e9 f;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  bool cond;
  ostream *poVar8;
  pointer pmVar9;
  pointer pmVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  pointer puVar14;
  int iVar15;
  uint uVar16;
  pointer pTVar17;
  long lVar18;
  size_t prefix;
  uint local_1d4;
  int overlap_type;
  uint local_1cc;
  _Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> local_1c8;
  ulong local_1a8;
  int my_schedule;
  vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_> msgs;
  int left_p;
  _Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> local_168;
  unsigned_long local_150;
  size_t rebucket_offset;
  size_t unresolved_els;
  TwoBSA<unsigned_int> tuple;
  vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_> out_of_bounds_msgs;
  vector<int,_std::allocator<int>_> schedule;
  _Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> active_elements;
  pointer local_a8;
  size_t unfinished_b;
  block_decomposition_buffered<unsigned_int> *local_98;
  ulong local_90;
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
  minqueries;
  
  comm = &this->comm;
  local_1d4 = mxx::left_shift<unsigned_int>
                        ((param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,comm);
  local_98 = &this->part;
  prefix = (size_t)(this->part).prefix;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar13 = 0;
      puVar2 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(param_1->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
      uVar13 = uVar13 + 1) {
    uVar1 = puVar2[uVar13];
    if (((prefix + uVar13 + 1 != (ulong)uVar1) ||
        ((uVar11 = this->local_size - 1, uVar13 < uVar11 && (uVar1 == puVar2[uVar13 + 1])))) ||
       ((uVar13 == uVar11 && ((uVar1 == local_1d4 && ((this->comm).m_rank < this->p + -1)))))) {
      tuple.B1 = (uint)uVar13;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&active_elements,&tuple.B1);
    }
  }
  std::__cxx11::string::string((string *)&tuple,"get active elements",(allocator *)&msgs);
  std::__cxx11::string::~string((string *)&tuple);
  if ((this->comm).m_rank < this->p + -1) {
    puVar2 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_1cc = (uint)CONCAT71((int7)((ulong)puVar2 >> 8),puVar2[-1] == local_1d4);
  }
  else {
    local_1cc = 0;
  }
  do {
    puVar2 = active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (this->n <= (ulong)(uint)dist) break;
    msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unresolved_els = 0;
    unfinished_b = 0;
    msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8 = (ulong)(uint)dist;
    for (puVar14 = active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar14 != puVar2;
        puVar14 = puVar14 + 1) {
      uVar13 = (ulong)*puVar14;
      lVar18 = prefix + uVar13;
      tuple.B1 = (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar13] + (int)local_1a8;
      tuple.B2 = (uint)lVar18;
      if ((ulong)tuple.B1 < this->n) {
        std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
        emplace_back<mypair<unsigned_int>>
                  ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)&msgs,
                   (mypair<unsigned_int> *)&tuple);
      }
      else {
        tuple.B1 = 0;
        std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
        emplace_back<mypair<unsigned_int>>
                  ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)
                   &out_of_bounds_msgs,(mypair<unsigned_int> *)&tuple);
      }
      unresolved_els = unresolved_els + 1;
      if (lVar18 + 1U ==
          (ulong)(param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar13]) {
        unfinished_b = unfinished_b + 1;
      }
    }
    local_150 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&unresolved_els,comm);
    mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&unfinished_b,comm);
    uVar13 = local_1a8;
    iVar15 = (int)local_1a8;
    if ((this->comm).m_rank == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," unresolved = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," unfinished = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    if (local_150 != 0) {
      mxx::
      all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_1_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      puVar2 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pmVar10 = msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pmVar10 !=
          msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish; pmVar10 = pmVar10 + 1) {
        pmVar10->first = puVar2[pmVar10->first - prefix];
      }
      mxx::
      all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_2_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>::
        insert<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>,void>
                  ((vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>> *)&msgs,
                   (const_iterator)
                   msgs.
                   super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<mypair<unsigned_int>_*,_std::vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>_>
                    )out_of_bounds_msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<mypair<unsigned_int>_*,_std::vector<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>_>
                    )out_of_bounds_msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        out_of_bounds_msgs.
        super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             out_of_bounds_msgs.
             super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if ((long)msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != unresolved_els) {
        __assert_fail("msgs.size() == unresolved_els",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x5be,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<mypair<unsigned_int>*,std::vector<mypair<unsigned_int>,std::allocator<mypair<unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&,mypair<unsigned_int>const&)_1_>>
                ();
      local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      overlap_type = 0;
      local_90 = (ulong)(*(param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_start - 1);
      local_a8 = (pointer)0x0;
      pmVar10 = msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (iVar15 = (int)uVar13,
            pmVar10 !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
        uVar1 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[pmVar10->second - prefix];
        uVar13 = (ulong)(uVar1 - 1);
        if (uVar1 - 1 != pmVar10->second && prefix <= uVar13) {
          __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5dc,
                        "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                       );
        }
        for (; pTVar7 = local_e8._M_impl.super__Vector_impl_data._M_end_of_storage,
            pTVar6 = local_e8._M_impl.super__Vector_impl_data._M_finish,
            pTVar5 = local_e8._M_impl.super__Vector_impl_data._M_start,
            pTVar4 = local_168._M_impl.super__Vector_impl_data._M_end_of_storage,
            pTVar3 = local_168._M_impl.super__Vector_impl_data._M_finish,
            pTVar17 = local_168._M_impl.super__Vector_impl_data._M_start,
            pmVar10 !=
            msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish; pmVar10 = pmVar10 + 1) {
          uVar11 = (ulong)pmVar10->second;
          lVar18 = uVar11 - prefix;
          puVar2 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar2[lVar18] != uVar1) goto LAB_0015251d;
          if ((uVar11 < prefix) || (prefix + this->local_size <= uVar11)) {
            __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5e1,
                          "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                         );
          }
          tuple.SA = (this->local_SA).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar18];
          tuple.B1 = puVar2[lVar18];
          tuple.B2 = pmVar10->first;
          std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::push_back
                    ((vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *)
                     &local_1c8,&tuple);
        }
        if ((local_1cc & 1) == 0) {
LAB_0015251d:
          if (uVar13 < prefix) {
            overlap_type = overlap_type + 1;
            local_168._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_168._M_impl.super__Vector_impl_data._M_start =
                 local_1c8._M_impl.super__Vector_impl_data._M_start;
            local_168._M_impl.super__Vector_impl_data._M_finish =
                 local_1c8._M_impl.super__Vector_impl_data._M_finish;
            local_1c8._M_impl.super__Vector_impl_data._M_start = pTVar17;
            local_1c8._M_impl.super__Vector_impl_data._M_finish = pTVar3;
            local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar4;
          }
          else {
            std::
            __sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_1c8._M_impl.super__Vector_impl_data._M_start,
                       local_1c8._M_impl.super__Vector_impl_data._M_finish);
            puVar2 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((uVar13 - prefix != 0) && (uVar1 <= puVar2[(uVar13 - prefix) + -1])) {
              __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x603,
                            "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                           );
            }
            puVar14 = (this->local_SA).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar18 = 0;
            uVar16 = uVar1;
            for (pTVar17 = local_1c8._M_impl.super__Vector_impl_data._M_start;
                pTVar17 != local_1c8._M_impl.super__Vector_impl_data._M_finish;
                pTVar17 = pTVar17 + 1) {
              if ((pTVar17 != local_1c8._M_impl.super__Vector_impl_data._M_start) &&
                 (pTVar17[-1].B2 != pTVar17->B2)) {
                uVar16 = uVar1 + (int)lVar18;
              }
              puVar14[(uVar13 + lVar18) - prefix] = pTVar17->SA;
              puVar2[(uVar13 + lVar18) - prefix] = uVar16;
              lVar18 = lVar18 + 1;
            }
            if (((prefix - uVar13) + this->local_size != lVar18) &&
               (~uVar13 + (ulong)puVar2[(uVar13 + lVar18) - prefix] != lVar18)) {
              __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x620,
                            "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                           );
            }
          }
        }
        else {
          if ((this->p + -1 <= (this->comm).m_rank) ||
             ((param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1] != local_1d4)) {
            __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5eb,
                          "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                         );
          }
          if (uVar13 < prefix) {
            local_168._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_168._M_impl.super__Vector_impl_data._M_start =
                 local_1c8._M_impl.super__Vector_impl_data._M_start;
            local_168._M_impl.super__Vector_impl_data._M_finish =
                 local_1c8._M_impl.super__Vector_impl_data._M_finish;
            local_1c8._M_impl.super__Vector_impl_data._M_start = pTVar17;
            local_1c8._M_impl.super__Vector_impl_data._M_finish = pTVar3;
            local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar4;
            overlap_type = 4;
          }
          else {
            overlap_type = overlap_type + 2;
            local_e8._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_e8._M_impl.super__Vector_impl_data._M_start =
                 local_1c8._M_impl.super__Vector_impl_data._M_start;
            local_e8._M_impl.super__Vector_impl_data._M_finish =
                 local_1c8._M_impl.super__Vector_impl_data._M_finish;
            local_1c8._M_impl.super__Vector_impl_data._M_start = pTVar5;
            local_1c8._M_impl.super__Vector_impl_data._M_finish = pTVar6;
            local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar7;
            local_a8 = (pointer)(uVar13 - prefix);
          }
        }
        uVar13 = local_1a8;
        if (local_1c8._M_impl.super__Vector_impl_data._M_finish !=
            local_1c8._M_impl.super__Vector_impl_data._M_start) {
          local_1c8._M_impl.super__Vector_impl_data._M_finish =
               local_1c8._M_impl.super__Vector_impl_data._M_start;
        }
      }
      my_schedule = -1;
      if ((this->comm).m_rank == 0) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&tuple,(long)this->p,
                   (allocator_type *)&schedule);
        MPI_Gather(&overlap_type,1,&ompi_mpi_int,CONCAT44(tuple.B2,tuple.B1),1,&ompi_mpi_int,0,
                   (this->comm).mpi_comm);
        std::vector<int,_std::allocator<int>_>::vector
                  (&schedule,(long)this->p,(allocator_type *)&rebucket_offset);
        iVar12 = 0;
        for (lVar18 = 0; lVar18 < this->p; lVar18 = lVar18 + 1) {
          switch(*(undefined4 *)(CONCAT44(tuple.B2,tuple.B1) + lVar18 * 4)) {
          case 0:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18] = -1;
            break;
          case 1:
          case 4:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18] = iVar12;
            break;
          case 2:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18] = 0;
            iVar12 = 0;
            break;
          case 3:
            schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18] = iVar12;
            iVar12 = 1 - iVar12;
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x64d,
                          "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                         );
          }
        }
        MPI_Scatter(schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,
                    (this->comm).mpi_comm);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&schedule.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&tuple);
      }
      else {
        MPI_Gather(&overlap_type,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        MPI_Scatter(0,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
      }
      for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
        std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::vector
                  ((vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *)&tuple,
                   (vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *)
                   &local_168);
        uVar13 = local_90;
        left_p = mxx::partition::block_decomposition_buffered<unsigned_int>::target_processor
                           (local_98,(uint)local_90);
        schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        rebucket_offset = uVar13;
        if (iVar12 == my_schedule || overlap_type != 3) {
          if (overlap_type == 2 && iVar12 == my_schedule) goto LAB_00152841;
          cond = overlap_type != 0 && iVar12 == my_schedule;
        }
        else {
LAB_00152841:
          std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::operator=
                    ((vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *)&tuple,
                     (vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *)
                     &local_e8);
          left_p = (this->comm).m_rank;
          schedule.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = local_a8;
          rebucket_offset = prefix + (long)local_a8;
          cond = true;
        }
        f.border_bucket =
             (vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *)&tuple;
        f.left_p = &left_p;
        f.this = this;
        f.rebucket_offset = &rebucket_offset;
        f.minqueries = &minqueries;
        f.bucket_offset = (size_t *)&schedule;
        f.local_B = param_1;
        f.prefix = &prefix;
        mxx::comm::
        with_subset<suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mxx::comm_const&)_1_>
                  (comm,cond,f);
        mxx::comm::barrier(comm);
        std::_Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::
        ~_Vector_base((_Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *)
                      &tuple);
      }
      local_1d4 = mxx::left_shift<unsigned_int>
                            ((param_1->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start,comm);
      if ((this->comm).m_rank < this->p + -1) {
        puVar2 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_1cc = (uint)CONCAT71((int7)((ulong)puVar2 >> 8),puVar2[-1] == local_1d4);
      }
      else {
        local_1cc = 0;
      }
      pmVar10 = msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
      }
      for (; pmVar10 !=
             msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish; pmVar10 = pmVar10 + 1) {
        tuple.B1 = pmVar10->second - (int)prefix;
        uVar13 = (ulong)tuple.B1;
        puVar2 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = puVar2[uVar13];
        if (((uVar1 != pmVar10->second + 1) ||
            ((uVar11 = this->local_size - 1, uVar13 < uVar11 && (puVar2[tuple.B1 + 1] == uVar1))))
           || ((uVar11 == uVar13 && ((local_1d4 == uVar1 && ((this->comm).m_rank < this->p + -1)))))
           ) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&active_elements,&tuple.B1);
        }
      }
      puVar2 = (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar14 = (param_1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      for (pmVar9 = msgs.
                    super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pmVar9 != pmVar10;
          pmVar9 = pmVar9 + 1) {
        lVar18 = pmVar9->second - prefix;
        pmVar9->first = puVar2[lVar18];
        pmVar9->second = puVar14[lVar18];
      }
      mxx::
      all2all_func<mypair<unsigned_int>,suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_int,false>::construct_msgs(std::vector<unsigned_int,std::allocator<unsigned_int>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,int)::_lambda(mypair<unsigned_int>const&)_3_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      puVar2 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pmVar10 = msgs.
                     super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pmVar10 !=
          msgs.super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish; pmVar10 = pmVar10 + 1) {
        puVar2[pmVar10->first - prefix] = pmVar10->second;
      }
      std::__cxx11::string::string
                ((string *)&tuple,"bucket-chaising iteration",(allocator *)&schedule);
      std::__cxx11::string::~string((string *)&tuple);
      std::
      _Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base(&minqueries.
                       super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                     );
      std::_Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::~_Vector_base
                (&local_e8);
      std::_Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::~_Vector_base
                (&local_168);
      std::_Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::~_Vector_base
                (&local_1c8);
    }
    std::_Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>::~_Vector_base
              (&out_of_bounds_msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>);
    std::_Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>::~_Vector_base
              (&msgs.
                super__Vector_base<mypair<unsigned_int>,_std::allocator<mypair<unsigned_int>_>_>);
    dist = iVar15 * 2;
  } while (local_150 != 0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&active_elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}